

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

int MuxImageCount(WebPMuxImage *wpi_list,WebPChunkId id)

{
  int iVar1;
  
  if (wpi_list != (WebPMuxImage *)0x0) {
    iVar1 = (*(code *)(&DAT_0012c900 + *(int *)(&DAT_0012c900 + (ulong)(id - WEBP_CHUNK_ANMF) * 4)))
                      (wpi_list,id,kChunks,
                       &DAT_0012c900 + *(int *)(&DAT_0012c900 + (ulong)(id - WEBP_CHUNK_ANMF) * 4),
                       wpi_list);
    return iVar1;
  }
  return 0;
}

Assistant:

int MuxImageCount(const WebPMuxImage* wpi_list, WebPChunkId id) {
  int count = 0;
  const WebPMuxImage* current;
  for (current = wpi_list; current != NULL; current = current->next) {
    if (id == WEBP_CHUNK_NIL) {
      ++count;  // Special case: count all images.
    } else {
      const WebPChunk* const wpi_chunk = *GetChunkListFromId(current, id);
      if (wpi_chunk != NULL) {
        const WebPChunkId wpi_chunk_id = ChunkGetIdFromTag(wpi_chunk->tag);
        if (wpi_chunk_id == id) ++count;  // Count images with a matching 'id'.
      }
    }
  }
  return count;
}